

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O0

SO3<mnf::ExpMapQuaternion> * __thiscall
mnf::SO3<mnf::ExpMapQuaternion>::toString
          (SO3<mnf::ExpMapQuaternion> *this,ConstRefVec *val,string *prefix,IOFormat *fmt)

{
  ostream *s;
  Scalar *dataPtr;
  IOFormat *in_R8;
  Stride<0,_0> local_2fa;
  Map<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> local_2f8;
  WithFormat<Eigen::Map<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_2e8;
  stringstream local_1d8 [8];
  stringstream ss;
  ostream local_1c8 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [8];
  string matPrefix;
  IOFormat *fmt_local;
  string *prefix_local;
  ConstRefVec *val_local;
  SO3<mnf::ExpMapQuaternion> *this_local;
  
  std::operator+(local_50,(char)fmt);
  std::__cxx11::stringstream::stringstream(local_1d8);
  s = std::operator<<(local_1c8,(string *)local_50);
  dataPtr = Eigen::
            MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::data((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                    *)prefix);
  Eigen::Stride<0,_0>::Stride(&local_2fa);
  Eigen::Map<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (&local_2f8,dataPtr,&local_2fa);
  Eigen::DenseBase<Eigen::Map<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::format(&local_2e8,
           (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>
            *)&local_2f8,in_R8);
  Eigen::operator<<(s,&local_2e8);
  Eigen::
  WithFormat<Eigen::Map<const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  ~WithFormat(&local_2e8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

inline std::string SO3<Map>::toString(const ConstRefVec& val,
                                      const std::string& prefix,
                                      const Eigen::IOFormat& fmt) const
{
  std::string matPrefix = prefix + '[';
  std::stringstream ss;
  ss << matPrefix
     << (Eigen::Map<const typename Map::DisplayType>(val.data())).format(fmt);
  return ss.str();
}